

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

CType * lj_cdata_index(CTState *cts,GCcdata *cd,cTValue *key,uint8_t **pp,CTInfo *qual)

{
  CType *pCVar1;
  CType *fct_1;
  CType *pCStack_310;
  CTSize ofs_1;
  CType *sct;
  CType *fct;
  GCstr *pGStack_2f8;
  CTSize ofs;
  GCstr *name;
  CType *ctk;
  GCcdata *cdk;
  uint8_t *puStack_2d8;
  CTSize sz;
  lua_Number n;
  ptrdiff_t idx;
  CType *ct;
  uint8_t *p;
  CTInfo *qual_local;
  uint8_t **pp_local;
  cTValue *key_local;
  GCcdata *cd_local;
  CTState *cts_local;
  CType *local_288;
  CType *ct_2;
  GCcdata *local_278;
  GCstr *local_270;
  CType *ct_1;
  GCcdata *local_260;
  uint local_254;
  GCcdata *local_250;
  uint local_244;
  GCcdata *local_240;
  undefined4 local_234;
  GCcdata *local_230;
  uint local_224;
  CTState *local_220;
  GCstr *local_218;
  GCcdata *local_210;
  uint local_204;
  GCcdata *local_200;
  CType *local_1f8;
  GCcdata *local_1f0;
  uint local_1e4;
  GCcdata *local_1e0;
  ptrdiff_t local_1d8;
  GCcdata *local_1d0;
  uint local_1c4;
  GCcdata *local_1c0;
  GCstr *local_1b8;
  GCcdata *local_1b0;
  uint local_1a4;
  GCcdata *local_1a0;
  ptrdiff_t local_198;
  GCcdata *local_190;
  uint local_184;
  GCcdata *local_180;
  CType *local_178;
  CTState *local_170;
  uint local_164;
  CTState *local_160;
  int local_154;
  CType *local_150;
  CType *local_148;
  CType *local_130;
  uint *local_128;
  GCcdata *local_120;
  uint *local_118;
  GCcdata *local_110;
  uint local_104;
  GCcdata *local_100;
  CType *local_f8;
  GCcdata *local_f0;
  CType *local_e8;
  GCcdata *local_e0;
  uint local_d4;
  GCcdata *local_d0;
  uint local_c4;
  GCcdata *local_c0;
  uint local_b4;
  GCcdata *local_b0;
  uint local_a4;
  CTState *local_a0;
  uint local_94;
  GCcdata *local_90;
  uint local_84;
  GCcdata *local_80;
  uint local_74;
  GCcdata *local_70;
  uint local_64;
  GCcdata *local_60;
  uint local_54;
  GCcdata *local_50;
  uint local_44;
  CTState *local_40;
  undefined4 local_34;
  GCcdata *local_30;
  uint local_24;
  GCcdata *local_20;
  uint local_14;
  GCcdata *local_10;
  
  ct = (CType *)(cd + 1);
  local_44 = (uint)cd->ctypeid;
  pCVar1 = cts->tab + local_44;
  idx = (ptrdiff_t)pCVar1;
  local_40 = cts;
  local_220 = cts;
  local_224 = local_44;
  cd_local = (GCcdata *)cts;
  key_local = (cTValue *)cd;
  pp_local = (uint8_t **)key;
  qual_local = (CTInfo *)pp;
  p = (uint8_t *)qual;
  if ((pCVar1->info & 0xf0800000) == 0x20800000) {
    ct = *(CType **)ct;
    local_a4 = pCVar1->info & 0xffff;
    idx = (ptrdiff_t)(cts->tab + local_a4);
    local_a0 = cts;
    local_160 = cts;
    local_164 = local_a4;
    local_170 = cts;
    local_178 = pCVar1;
  }
  do {
    while (*(uint *)idx >> 0x1c == 8) {
      if ((*(uint *)idx >> 0x10 & 0xff) == 1) {
        *(uint *)p = *(uint *)(idx + 4) | *(uint *)p;
      }
      local_190 = cd_local;
      local_198 = idx;
      local_180 = cd_local;
      local_184 = *(uint *)idx & 0xffff;
      local_90 = cd_local;
      local_94 = local_184;
      idx = (cd_local->nextgc).gcptr64 + (ulong)local_184 * 0x18;
    }
    if ((uint)((long)*pp_local >> 0x2f) < 0xfffffff2) {
      puStack_2d8 = *pp_local;
      n = (lua_Number)(long)(double)puStack_2d8;
LAB_0017f987:
      if (*(uint *)idx >> 0x1d == 1) {
        cdk._4_4_ = lj_ctype_size((CTState *)cd_local,*(uint *)idx & 0xffff);
        if (cdk._4_4_ != 0xffffffff) {
          if (*(uint *)idx >> 0x1c == 2) {
            if (*(int *)(idx + 4) == 4) {
              local_130 = (CType *)(ulong)ct->info;
            }
            else {
              local_130 = *(CType **)ct;
            }
            ct = local_130;
          }
          else if ((*(uint *)idx & 0xc000000) != 0) {
            if ((*(uint *)idx & 0x4000000) != 0) {
              n = (lua_Number)((ulong)n & 1);
            }
            *(uint *)p = *(uint *)p | 0x2000000;
          }
          *(CTInfo **)qual_local = (CTInfo *)((long)&ct->info + (long)n * (long)(int)cdk._4_4_);
          return (CType *)idx;
        }
        lj_err_caller((lua_State *)cd_local[1].nextgc.gcptr64,LJ_ERR_FFI_INVSIZE);
      }
    }
    else if ((int)((long)*pp_local >> 0x2f) == -0xb) {
      ctk = (CType *)((ulong)*pp_local & 0x7fffffffffff);
      local_260 = cd_local;
      ct_1._4_4_ = (uint)ctk->next;
      local_250 = cd_local;
      local_10 = cd_local;
      local_270 = (GCstr *)((cd_local->nextgc).gcptr64 + (ulong)ct_1._4_4_ * 0x18);
      while ((uint)(local_270->nextgc).gcptr64 >> 0x1c == 8) {
        local_210 = cd_local;
        local_218 = local_270;
        local_200 = cd_local;
        local_204 = (uint)(local_270->nextgc).gcptr64 & 0xffff;
        local_50 = cd_local;
        local_270 = (GCstr *)((cd_local->nextgc).gcptr64 + (ulong)local_204 * 0x18);
        local_54 = local_204;
      }
      name = local_270;
      if ((uint)(local_270->nextgc).gcptr64 >> 0x1c == 5) {
        local_1b0 = cd_local;
        local_1b8 = local_270;
        local_1a4 = (uint)(local_270->nextgc).gcptr64 & 0xffff;
        local_1a0 = cd_local;
        local_80 = cd_local;
        name = (GCstr *)((cd_local->nextgc).gcptr64 + (ulong)local_1a4 * 0x18);
        local_84 = local_1a4;
      }
      local_254 = ct_1._4_4_;
      local_14 = ct_1._4_4_;
      if (((name->nextgc).gcptr64 & 0xfc000000) == 0) {
        local_230 = cd_local;
        local_234 = 0xb;
        local_30 = cd_local;
        local_34 = 0xb;
        lj_cconv_ct_ct((CTState *)cd_local,(CType *)((cd_local->nextgc).gcptr64 + 0x108),
                       (CType *)name,(uint8_t *)&n,(uint8_t *)&ctk->name,0);
        goto LAB_0017f987;
      }
    }
    else if ((int)((long)*pp_local >> 0x2f) == -5) {
      pGStack_2f8 = (GCstr *)((ulong)*pp_local & 0x7fffffffffff);
      if (*(uint *)idx >> 0x1c == 1) {
        pCVar1 = lj_ctype_getfieldq((CTState *)cd_local,(CType *)idx,pGStack_2f8,
                                    (CTSize *)((long)&fct + 4),(CTInfo *)p);
        if (pCVar1 != (CType *)0x0) {
          *(ulong *)qual_local = (long)&ct->info + (ulong)fct._4_4_;
          return pCVar1;
        }
        sct = (CType *)0x0;
      }
      else if ((*(uint *)idx & 0xf4000000) == 0x34000000) {
        if (pGStack_2f8->len == 2) {
          *(uint *)p = *(uint *)p | 0x2000000;
          if (((char)pGStack_2f8[1].nextgc.gcptr64 == 'r') &&
             (*(char *)((long)&pGStack_2f8[1].nextgc.gcptr64 + 1) == 'e')) {
            *(CType **)qual_local = ct;
            return (CType *)idx;
          }
          if (((char)pGStack_2f8[1].nextgc.gcptr64 == 'i') &&
             (*(char *)((long)&pGStack_2f8[1].nextgc.gcptr64 + 1) == 'm')) {
            *(ulong *)qual_local = (long)&ct->info + (ulong)(*(uint *)(idx + 4) >> 1);
            return (CType *)idx;
          }
        }
      }
      else if (*(short *)((long)key_local + 10) == 0x16) {
        ct_2._4_4_ = ct->info;
        local_278 = cd_local;
        local_240 = cd_local;
        local_20 = cd_local;
        local_288 = (CType *)((cd_local->nextgc).gcptr64 + (ulong)ct_2._4_4_ * 0x18);
        while (local_288->info >> 0x1c == 8) {
          local_1f0 = cd_local;
          local_1f8 = local_288;
          local_1e0 = cd_local;
          local_1e4 = local_288->info & 0xffff;
          local_60 = cd_local;
          local_64 = local_1e4;
          local_288 = (CType *)((cd_local->nextgc).gcptr64 + (ulong)local_1e4 * 0x18);
        }
        pCStack_310 = local_288;
        if (local_288->info >> 0x1c == 2) {
          local_f0 = cd_local;
          local_f8 = local_288;
          do {
            local_e0 = cd_local;
            local_e8 = local_f8;
            local_d4 = local_f8->info & 0xffff;
            local_d0 = cd_local;
            local_c0 = cd_local;
            pCStack_310 = (CType *)((cd_local->nextgc).gcptr64 + (ulong)local_d4 * 0x18);
            local_f8 = pCStack_310;
            local_c4 = local_d4;
          } while (pCStack_310->info >> 0x1c == 8);
        }
        local_244 = ct_2._4_4_;
        local_24 = ct_2._4_4_;
        if (((pCStack_310->info >> 0x1c == 1) &&
            (pCVar1 = lj_ctype_getfieldq((CTState *)cd_local,pCStack_310,pGStack_2f8,
                                         (CTSize *)((long)&fct_1 + 4),(CTInfo *)0x0),
            pCVar1 != (CType *)0x0)) && (pCVar1->info >> 0x1c == 0xb)) {
          return pCVar1;
        }
        idx = (ptrdiff_t)pCStack_310;
      }
    }
    if (*(uint *)idx >> 0x1c != 2) {
LAB_0018027c:
      *(uint *)p = *(uint *)p | 1;
      return (CType *)idx;
    }
    local_120 = cd_local;
    local_128 = (uint *)idx;
    do {
      local_110 = cd_local;
      local_118 = local_128;
      local_100 = cd_local;
      local_b4 = *local_128 & 0xffff;
      local_b0 = cd_local;
      local_128 = (uint *)((cd_local->nextgc).gcptr64 + (ulong)local_b4 * 0x18);
    } while (*local_128 >> 0x1c == 8);
    if (*local_128 >> 0x1c != 1) goto LAB_0018027c;
    local_150 = ct;
    local_154 = *(int *)(idx + 4);
    if (local_154 == 4) {
      local_148 = (CType *)(ulong)ct->info;
    }
    else {
      local_148 = *(CType **)ct;
    }
    ct = local_148;
    local_1d0 = cd_local;
    local_1d8 = idx;
    local_1c0 = cd_local;
    local_74 = *(uint *)idx & 0xffff;
    local_70 = cd_local;
    idx = (cd_local->nextgc).gcptr64 + (ulong)local_74 * 0x18;
    local_104 = local_b4;
    local_1c4 = local_74;
  } while( true );
}

Assistant:

CType *lj_cdata_index(CTState *cts, GCcdata *cd, cTValue *key, uint8_t **pp,
		      CTInfo *qual)
{
  uint8_t *p = (uint8_t *)cdataptr(cd);
  CType *ct = ctype_get(cts, cd->ctypeid);
  ptrdiff_t idx;

  /* Resolve reference for cdata object. */
  if (ctype_isref(ct->info)) {
    lj_assertCTS(ct->size == CTSIZE_PTR, "ref is not pointer-sized");
    p = *(uint8_t **)p;
    ct = ctype_child(cts, ct);
  }

collect_attrib:
  /* Skip attributes and collect qualifiers. */
  while (ctype_isattrib(ct->info)) {
    if (ctype_attrib(ct->info) == CTA_QUAL) *qual |= ct->size;
    ct = ctype_child(cts, ct);
  }
  /* Interning rejects refs to refs. */
  lj_assertCTS(!ctype_isref(ct->info), "bad ref of ref");

  if (tvisint(key)) {
    idx = (ptrdiff_t)intV(key);
    goto integer_key;
  } else if (tvisnum(key)) {  /* Numeric key. */
#ifdef _MSC_VER
    /* Workaround for MSVC bug. */
    volatile
#endif
    lua_Number n = numV(key);
    idx = LJ_64 ? (ptrdiff_t)n : (ptrdiff_t)lj_num2int(n);
  integer_key:
    if (ctype_ispointer(ct->info)) {
      CTSize sz = lj_ctype_size(cts, ctype_cid(ct->info));  /* Element size. */
      if (sz == CTSIZE_INVALID)
	lj_err_caller(cts->L, LJ_ERR_FFI_INVSIZE);
      if (ctype_isptr(ct->info)) {
	p = (uint8_t *)cdata_getptr(p, ct->size);
      } else if ((ct->info & (CTF_VECTOR|CTF_COMPLEX))) {
	if ((ct->info & CTF_COMPLEX)) idx &= 1;
	*qual |= CTF_CONST;  /* Valarray elements are constant. */
      }
      *pp = p + idx*(int32_t)sz;
      return ct;
    }
  } else if (tviscdata(key)) {  /* Integer cdata key. */
    GCcdata *cdk = cdataV(key);
    CType *ctk = ctype_raw(cts, cdk->ctypeid);
    if (ctype_isenum(ctk->info)) ctk = ctype_child(cts, ctk);
    if (ctype_isinteger(ctk->info)) {
      lj_cconv_ct_ct(cts, ctype_get(cts, CTID_INT_PSZ), ctk,
		     (uint8_t *)&idx, cdataptr(cdk), 0);
      goto integer_key;
    }
  } else if (tvisstr(key)) {  /* String key. */
    GCstr *name = strV(key);
    if (ctype_isstruct(ct->info)) {
      CTSize ofs;
      CType *fct = lj_ctype_getfieldq(cts, ct, name, &ofs, qual);
      if (fct) {
	*pp = p + ofs;
	return fct;
      }
    } else if (ctype_iscomplex(ct->info)) {
      if (name->len == 2) {
	*qual |= CTF_CONST;  /* Complex fields are constant. */
	if (strdata(name)[0] == 'r' && strdata(name)[1] == 'e') {
	  *pp = p;
	  return ct;
	} else if (strdata(name)[0] == 'i' && strdata(name)[1] == 'm') {
	  *pp = p + (ct->size >> 1);
	  return ct;
	}
      }
    } else if (cd->ctypeid == CTID_CTYPEID) {
      /* Allow indexing a (pointer to) struct constructor to get constants. */
      CType *sct = ctype_raw(cts, *(CTypeID *)p);
      if (ctype_isptr(sct->info))
	sct = ctype_rawchild(cts, sct);
      if (ctype_isstruct(sct->info)) {
	CTSize ofs;
	CType *fct = lj_ctype_getfield(cts, sct, name, &ofs);
	if (fct && ctype_isconstval(fct->info))
	  return fct;
      }
      ct = sct;  /* Allow resolving metamethods for constructors, too. */
    }
  }
  if (ctype_isptr(ct->info)) {  /* Automatically perform '->'. */
    if (ctype_isstruct(ctype_rawchild(cts, ct)->info)) {
      p = (uint8_t *)cdata_getptr(p, ct->size);
      ct = ctype_child(cts, ct);
      goto collect_attrib;
    }
  }
  *qual |= 1;  /* Lookup failed. */
  return ct;  /* But return the resolved raw type. */
}